

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_entry_retriever.hpp
# Opt level: O3

void __thiscall duckdb::CatalogEntryRetriever::~CatalogEntryRetriever(CatalogEntryRetriever *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Manager_type p_Var1;
  
  this_00 = (this->search_path).internal.
            super___shared_ptr<duckdb::CatalogSearchPath,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var1 = (this->callback).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

explicit CatalogEntryRetriever(ClientContext &context) : context(context) {
	}